

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O2

void __thiscall
VBitmap::Impl::reset
          (Impl *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,Format format)

{
  uint8_t uVar1;
  
  this->mRoData = data;
  this->mWidth = (uint32_t)width;
  this->mHeight = (uint32_t)height;
  this->mStride = (uint32_t)bytesPerLine;
  uVar1 = '\x01';
  if (format < 4) {
    uVar1 = (uint8_t)(0x20200801 >> (format * '\b' & 0x1f));
  }
  this->mFormat = format;
  this->mDepth = uVar1;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,
             (pointer)0x0);
  return;
}

Assistant:

void VBitmap::Impl::reset(uint8_t *data, size_t width, size_t height,
                          size_t bytesPerLine, VBitmap::Format format)
{
    mRoData = data;
    mWidth = uint32_t(width);
    mHeight = uint32_t(height);
    mStride = uint32_t(bytesPerLine);
    mFormat = format;
    mDepth = depth(format);
    mOwnData = nullptr;
}